

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_15::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  ostream *os;
  ulong uVar1;
  XmlEncode local_48;
  byte local_1a;
  byte local_19;
  bool tagWasOpen;
  string *psStack_18;
  bool indent_local;
  string *text_local;
  XmlWriter *this_local;
  
  local_19 = indent;
  psStack_18 = text;
  text_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_1a = this->m_tagIsOpen & 1;
    ensureTagClosed(this);
    if (((local_1a & 1) != 0) && ((local_19 & 1) != 0)) {
      std::operator<<(this->m_os,(string *)&this->m_indent);
    }
    os = this->m_os;
    XmlEncode::XmlEncode(&local_48,psStack_18,ForTextNodes);
    anon_unknown_15::operator<<(os,&local_48);
    XmlEncode::~XmlEncode(&local_48);
    this->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeText( std::string const& text, bool indent ) {
        if( !text.empty() ){
            bool tagWasOpen = m_tagIsOpen;
            ensureTagClosed();
            if( tagWasOpen && indent )
                m_os << m_indent;
            m_os << XmlEncode( text );
            m_needsNewline = true;
        }
        return *this;
    }